

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O0

_Bool duckdb_je_tcache_bins_ncached_max_write(tsd_t *tsd,char *settings,size_t len)

{
  _Bool _Var1;
  long in_RDI;
  arena_t *assigned_arena;
  cache_bin_info_t duckdb_je_tcache_bin_info [73];
  tcache_t *tcache;
  uint8_t state;
  arena_t *in_stack_ffffffffffffff18;
  tsd_t *tsd_00;
  cache_bin_info_t *in_stack_ffffffffffffff28;
  tcache_t *in_stack_ffffffffffffff30;
  _Bool *in_stack_ffffffffffffff40;
  cache_bin_info_t *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  
  tcache_bin_settings_backup(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  _Var1 = tcache_bin_info_settings_parse
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff40);
  if (!_Var1) {
    tsd_00 = *(tsd_t **)(*(long *)(in_RDI + 0x360) + 0x28);
    duckdb_je_tcache_cleanup(tsd_00);
    duckdb_je_tsd_tcache_data_init(tsd_00,in_stack_ffffffffffffff18,(cache_bin_info_t *)0x258684a);
  }
  return _Var1;
}

Assistant:

bool
tcache_bins_ncached_max_write(tsd_t *tsd, char *settings, size_t len) {
	assert(tcache_available(tsd));
	assert(len != 0);
	tcache_t *tcache = tsd_tcachep_get(tsd);
	assert(tcache != NULL);
	cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX];
	tcache_bin_settings_backup(tcache, tcache_bin_info);

	if(tcache_bin_info_settings_parse(settings, len, tcache_bin_info,
	    NULL)) {
		return true;
	}

	arena_t *assigned_arena = tcache->tcache_slow->arena;
	tcache_cleanup(tsd);
	tsd_tcache_data_init(tsd, assigned_arena,
	    tcache_bin_info);

	return false;
}